

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O1

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::resume_bfs
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  uint uVar1;
  pointer puVar2;
  vertex_t *pvVar3;
  pointer puVar4;
  pointer pvVar5;
  uint *puVar6;
  bool bVar7;
  ulong uVar8;
  uint *nxt;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar11 = (ulong)s;
  this->back_ = 0;
  this->front_ = 0;
  puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  if (uVar11 < uVar8) {
    if (puVar2[uVar11] == '?') {
      __assert_fail("dist.at(s) != INF8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/DynamicScalableKReach.cpp"
                    ,10,
                    "void DynamicScalableKReach::DynamicPartialIndex::resume_bfs(vertex_t, const std::vector<std::vector<vertex_t>> &, std::vector<distance_t> &)"
                   );
    }
    this->back_ = 1;
    pvVar3 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    if ((this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish == pvVar3) {
      uVar8 = 0;
      uVar11 = 0;
    }
    else {
      *pvVar3 = s;
      while( true ) {
        do {
          uVar11 = this->front_;
          if (this->back_ == uVar11) {
            return;
          }
          this->front_ = uVar11 + 1;
          puVar4 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar8 = (long)(this->queue_->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
          if (uVar8 <= uVar11) goto LAB_0010944a;
          uVar12 = (ulong)puVar4[uVar11];
          puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar8 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
          uVar11 = uVar12;
          if (uVar8 <= uVar12) goto LAB_0010944a;
        } while (this->k_ <= puVar2[uVar12]);
        pvVar5 = (graph->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar8 = ((long)(graph->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
                -0x5555555555555555;
        if (uVar8 < uVar12 || uVar8 - uVar12 == 0) break;
        puVar6 = *(pointer *)
                  ((long)&pvVar5[uVar12].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (puVar9 = pvVar5[uVar12].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar6;
            puVar9 = puVar9 + 1) {
          uVar10 = (ulong)*puVar9;
          puVar2 = (dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          uVar8 = (long)(dist->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
          uVar11 = uVar10;
          if ((uVar8 <= uVar10) || (uVar11 = uVar12, uVar8 <= uVar12)) goto LAB_0010944a;
          if ((puVar2[uVar12] + 1 < (uint)puVar2[uVar10]) &&
             ((puVar2[uVar10] = puVar2[uVar12] + 1, this->isD2_ != true ||
              (bVar7 = indexed(&this->parent_->D1_,*puVar9), !bVar7)))) {
            uVar1 = *puVar9;
            uVar11 = this->back_;
            this->back_ = uVar11 + 1;
            puVar4 = (this->queue_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = (long)(this->queue_->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
            if (uVar8 <= uVar11) goto LAB_0010944a;
            puVar4[uVar11] = uVar1;
          }
        }
      }
    }
  }
LAB_0010944a:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11,
             uVar8);
}

Assistant:

void DynamicScalableKReach::DynamicPartialIndex::resume_bfs(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                            std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    assert(dist.at(s) != INF8);
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) <= dist.at(cur) + 1) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (!isD2_ || !parent_.D1_.indexed(nxt)) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}